

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
::clear(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
        *this)

{
  bool bVar1;
  size_t sVar2;
  slot_type *slot;
  PolicyFunctions *policy;
  CommonFields *pCVar3;
  size_t cap;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
  *this_local;
  
  AssertNotDebugCapacity(this);
  sVar2 = capacity(this);
  if (sVar2 != 0) {
    bVar1 = is_soo(this);
    if (bVar1) {
      bVar1 = empty(this);
      if (!bVar1) {
        slot = soo_slot(this);
        destroy(this,slot);
      }
      pCVar3 = common(this);
      CommonFields::set_empty_soo(pCVar3);
    }
    else {
      destroy_slots(this);
      pCVar3 = common(this);
      policy = GetPolicyFunctions();
      bVar1 = SooEnabled();
      ClearBackingArray(pCVar3,policy,sVar2 < 0x80,bVar1);
    }
  }
  pCVar3 = common(this);
  CommonFieldsGenerationInfoDisabled::set_reserved_growth
            ((CommonFieldsGenerationInfoDisabled *)pCVar3,0);
  pCVar3 = common(this);
  CommonFieldsGenerationInfoDisabled::set_reservation_size
            ((CommonFieldsGenerationInfoDisabled *)pCVar3,0);
  return;
}

Assistant:

ABSL_ATTRIBUTE_REINITIALIZES void clear() {
    if (SwisstableGenerationsEnabled() &&
        capacity() >= InvalidCapacity::kMovedFrom) {
      common().set_capacity(DefaultCapacity());
    }
    AssertNotDebugCapacity();
    // Iterating over this container is O(bucket_count()). When bucket_count()
    // is much greater than size(), iteration becomes prohibitively expensive.
    // For clear() it is more important to reuse the allocated array when the
    // container is small because allocation takes comparatively long time
    // compared to destruction of the elements of the container. So we pick the
    // largest bucket_count() threshold for which iteration is still fast and
    // past that we simply deallocate the array.
    const size_t cap = capacity();
    if (cap == 0) {
      // Already guaranteed to be empty; so nothing to do.
    } else if (is_soo()) {
      if (!empty()) destroy(soo_slot());
      common().set_empty_soo();
    } else {
      destroy_slots();
      ClearBackingArray(common(), GetPolicyFunctions(), /*reuse=*/cap < 128,
                        SooEnabled());
    }
    common().set_reserved_growth(0);
    common().set_reservation_size(0);
  }